

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall
Server::SendProgramVector
          (Server *this,vector<Instruction,_std::allocator<Instruction>_> *V,int size)

{
  ssize_t sVar1;
  long lVar2;
  long lVar3;
  int local_34 [2];
  int size_local;
  
  sVar1 = send(this->newsockfd,local_34,4,0);
  this->n = (int)sVar1;
  if ((int)sVar1 < 0) {
    puts("ERROR writing to socket in server!");
  }
  if (0 < size) {
    lVar2 = 0;
    lVar3 = 0;
    local_34[0] = size;
    do {
      sVar1 = send(this->newsockfd,
                   (void *)((long)((V->super__Vector_base<Instruction,_std::allocator<Instruction>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->val + lVar2),0x28,0)
      ;
      this->n = (int)sVar1;
      if ((int)sVar1 < 0) {
        puts("ERROR writing to socket in server!");
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x28;
    } while (lVar3 < local_34[0]);
  }
  return;
}

Assistant:

void Server::SendProgramVector(std::vector<Instruction> V, int size)
{
    n = send(newsockfd, &size, sizeof(size), 0);
    if (n < 0)
        printf("ERROR writing to socket in server!\n");

    for (int i = 0; i < size; i++)
    {
        n = send(newsockfd, &V[i], sizeof(V[i]), 0);
        if (n < 0)
            printf("ERROR writing to socket in server!\n");
    }
}